

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiUtil.cpp
# Opt level: O1

bool ImGui::FileSave(char *label,char *btn,char *buf,size_t buf_size,char *title,int filter_num,
                    char **filter_patterns)

{
  bool bVar1;
  bool bVar2;
  char *__src;
  ImVec2 local_30;
  
  bVar1 = InputText(label,buf,buf_size,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar2 = Button(btn,&local_30);
  if (bVar2) {
    __src = tinyfd_saveFileDialog(title,"",filter_num,filter_patterns,(char *)0x0);
    bVar1 = true;
    if (__src != (char *)0x0) {
      strcpy(buf,__src);
    }
  }
  return bVar1;
}

Assistant:

bool FileSave(const char *label, const char *btn, char *buf, size_t buf_size, const char *title, int filter_num,
              const char *const *filter_patterns) {
	bool ret = ImGui::InputText(label, buf, buf_size);
	ImGui::SameLine();

	if (ImGui::Button(btn)) {
		const char *filename = tinyfd_saveFileDialog(title, "", filter_num, filter_patterns, nullptr);
		if (filename)
			strcpy(buf, filename);
		ret = true;
	}
	return ret;
}